

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::scale(mat4 *__return_storage_ptr__,float_t value)

{
  mat3 local_30;
  float_t local_c;
  float_t value_local;
  
  local_c = value;
  mat3::scale(&local_30,value);
  from_mat3(__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::scale(float_t value)
{
    return mat4::homogeneous::from_mat3(mat3::scale(value));
}